

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void testSelect(void)

{
  pointer *ppNVar1;
  Node *this;
  pointer pNVar2;
  FILE *pFVar3;
  pointer pNVar4;
  undefined8 uVar5;
  int iVar6;
  ElementData *pEVar7;
  char *in_RCX;
  fd_set *in_R8;
  char *in_R9;
  Nodes nodes;
  undefined1 local_528 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  string source;
  Node mainNode;
  undefined1 local_460 [24];
  Node node;
  stringstream buffer;
  ostream local_3b0 [112];
  ios_base local_340 [264];
  ifstream file;
  streambuf local_228 [504];
  
  std::ifstream::ifstream(&file,"source/parseTest.html",_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&buffer);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  crawler::parse(&node,&source);
  ppNVar1 = &mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mainNode,"div","");
  crawler::Node::select
            ((Node *)&nodes,(int)&node,(fd_set *)&mainNode,(fd_set *)in_RCX,in_R8,(timeval *)in_R9);
  this = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  pNVar2 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppNVar1) {
    operator_delete(mainNode.children.
                    super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&((mainNode.children.
                                     super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->children).
                                   super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
    this = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
    pNVar2 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pNVar4 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      this != nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
              super__Vector_impl_data._M_finish; this = this + 1) {
    test_count = test_count + 1;
    nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar2;
    pEVar7 = crawler::Node::getElementData(this);
    iVar6 = strcmp((pEVar7->tagName)._M_dataplus._M_p,"div");
    pFVar3 = _stderr;
    if (iVar6 == 0) {
      test_pass = test_pass + 1;
    }
    else {
      crawler::Node::getElementData(this);
      in_RCX = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp";
      in_R8 = (fd_set *)0xd5;
      in_R9 = "strcmp((result.getElementData().getTagName().c_str()), (\"div\")) == 0";
      fprintf(pFVar3,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
              "testSelect");
    }
    pNVar2 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
             super__Vector_impl_data._M_finish;
    nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
    super__Vector_impl_data._M_finish = pNVar4;
  }
  nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar2;
  mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppNVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mainNode,"#main","");
  crawler::Node::select
            ((Node *)local_460,(int)&node,(fd_set *)&mainNode,(fd_set *)in_RCX,in_R8,
             (timeval *)in_R9);
  local_518._M_allocated_capacity =
       (size_type)
       nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_528._8_8_ =
       nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_528._0_8_ =
       nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
       super__Vector_impl_data._M_start;
  nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_460._0_8_;
  nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_460._8_8_;
  nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_460._16_8_;
  local_460._0_8_ = (pointer)0x0;
  local_460._8_8_ = (pointer)0x0;
  local_460._16_8_ = (pointer)0x0;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_528);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector
            ((vector<crawler::Node,_std::allocator<crawler::Node>_> *)local_460);
  if (mainNode.children.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppNVar1) {
    operator_delete(mainNode.children.
                    super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&((mainNode.children.
                                     super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->children).
                                   super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
  test_count = test_count + 1;
  if ((long)nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
            super__Vector_impl_data._M_start == 0x88) {
    test_pass = test_pass + 1;
  }
  else {
    testSelect();
  }
  pNVar2 = nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector
            (&mainNode.children,
             &(nodes.super__Vector_base<crawler::Node,_std::allocator<crawler::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  mainNode.nodeType = pNVar2->nodeType;
  std::__detail::__variant::
  _Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&mainNode.nodeData,
                    (_Copy_ctor_base<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&pNVar2->nodeData);
  mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pNVar2->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (pNVar2->parent).super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  test_count = test_count + 1;
  pEVar7 = crawler::Node::getElementData(&mainNode);
  iVar6 = strcmp((pEVar7->tagName)._M_dataplus._M_p,"div");
  pFVar3 = _stderr;
  if (iVar6 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar7 = crawler::Node::getElementData(&mainNode);
    fprintf(pFVar3,"function %s(): %s:%d  Assertion `%s` failed. expect: %s actual: %s\n",
            "testSelect",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ramsayleung[P]crawler/test.cpp"
            ,0xda,"strcmp((mainNode.getElementData().getTagName().c_str()), (\"div\")) == 0",
            (pEVar7->tagName)._M_dataplus._M_p,"div");
  }
  test_count = test_count + 1;
  pEVar7 = crawler::Node::getElementData(&mainNode);
  crawler::ElementData::clazz_abi_cxx11_((string *)local_528,pEVar7);
  uVar5 = local_528._0_8_;
  iVar6 = strcmp((char *)local_528._0_8_,"test");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uVar5 != &local_518) {
    operator_delete((void *)uVar5,(ulong)(local_518._M_allocated_capacity + 1));
  }
  if (iVar6 == 0) {
    test_pass = test_pass + 1;
  }
  else {
    pEVar7 = crawler::Node::getElementData(&mainNode);
    crawler::ElementData::clazz_abi_cxx11_((string *)local_528,pEVar7);
    testSelect();
  }
  if (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (mainNode.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&mainNode.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&mainNode.children);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&nodes);
  if (node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (node.parent.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::__detail::__variant::
  _Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&node.nodeData);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::~vector(&node.children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)source._M_dataplus._M_p != &source.field_2) {
    operator_delete(source._M_dataplus._M_p,source.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&buffer);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void testSelect() {
  std::ifstream file("source/parseTest.html");
  std::stringstream buffer;
  buffer << file.rdbuf();
  std::string source = buffer.str();
  crawler::Node node = crawler::parse(source);
  crawler::Nodes nodes = node.select("div");
  for (auto const &result : nodes) {
    ASSERT_CSTRING_EQ(result.getElementData().getTagName().c_str(), "div");
  }
  nodes = node.select("#main");
  ASSERT_TRUE(nodes.size() == 1);
  crawler::Node mainNode = nodes.front();
  ASSERT_CSTRING_EQ(mainNode.getElementData().getTagName().c_str(), "div");
  ASSERT_CSTRING_EQ(mainNode.getElementData().clazz().c_str(), "test");
}